

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_flip_closed(roaring64_bitmap_t *r1,uint64_t min,uint64_t max)

{
  art_ref_t ref;
  _Bool _Var1;
  uint8_t type;
  int iVar2;
  roaring64_bitmap_t *prVar3;
  ulong uVar4;
  container_t *pcVar5;
  leaf_t lVar6;
  art_val_t *paVar7;
  ulong uVar8;
  roaring64_bitmap_t *prVar9;
  uint64_t *puVar10;
  roaring64_bitmap_t *extraout_RAX;
  uint uVar11;
  uint uVar12;
  roaring64_bitmap_t *prVar13;
  long lVar14;
  array_container_t *src;
  uint8_t uVar15;
  uint uVar16;
  uint *key;
  undefined8 *puVar17;
  uint32_t min_00;
  bool bVar18;
  undefined1 auVar19 [16];
  uint8_t current_high48_key [6];
  uint8_t min_high48_key [6];
  uint8_t max_high48_key [6];
  art_iterator_t iterator;
  roaring64_bitmap_t *local_100;
  uint local_f8;
  ushort local_f4;
  uint local_f0;
  ushort local_ec;
  ulong local_e8;
  uint local_e0;
  ushort local_dc;
  ulong local_d8;
  roaring64_bitmap_t *local_d0;
  ulong local_c8;
  art_iterator_t local_c0;
  
  if (max < min) {
    prVar3 = roaring64_bitmap_copy(r1);
    return prVar3;
  }
  local_f0 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
             (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
  local_ec = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
  local_e0 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
             (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
  local_dc = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
  local_e8 = min >> 0x10;
  local_d8 = max >> 0x10;
  prVar3 = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
  (prVar3->art).root = 0;
  (prVar3->art).first_free[0] = 0;
  (prVar3->art).first_free[1] = 0;
  (prVar3->art).first_free[2] = 0;
  (prVar3->art).first_free[3] = 0;
  (prVar3->art).first_free[4] = 0;
  (prVar3->art).first_free[5] = 0;
  (prVar3->art).capacities[0] = 0;
  (prVar3->art).capacities[1] = 0;
  (prVar3->art).capacities[2] = 0;
  (prVar3->art).capacities[3] = 0;
  (prVar3->art).capacities[4] = 0;
  (prVar3->art).capacities[5] = 0;
  (prVar3->art).nodes[1] = (art_node_t *)0x0;
  (prVar3->art).nodes[2] = (art_node_t *)0x0;
  (prVar3->art).nodes[3] = (art_node_t *)0x0;
  (prVar3->art).nodes[4] = (art_node_t *)0x0;
  *(undefined8 *)((long)(prVar3->art).nodes + 0x21) = 0;
  *(undefined8 *)((long)(prVar3->art).nodes + 0x29) = 0;
  prVar3->first_free = 0;
  prVar3->capacity = 0;
  prVar3->containers = (container_t **)0x0;
  memset(&local_c0,0,0x90);
  ref = (r1->art).root;
  local_c0.art = &r1->art;
  if ((ref != 0) && (art_node_init_iterator(ref,&local_c0,true), local_c0.value != (ulong *)0x0)) {
    do {
      uVar11 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
               (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
      uVar12 = local_f0 >> 0x18 | (local_f0 & 0xff0000) >> 8 | (local_f0 & 0xff00) << 8 |
               local_f0 << 0x18;
      if (uVar11 == uVar12) {
        uVar11 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
        uVar12 = (uint)(ushort)(local_ec << 8 | local_ec >> 8);
        uVar16 = 0;
        if (uVar11 != uVar12) goto LAB_00128df6;
      }
      else {
LAB_00128df6:
        uVar16 = -(uint)(uVar11 < uVar12) | 1;
      }
      if (-1 < (int)uVar16) break;
      uVar4 = *local_c0.value;
      puVar17 = (undefined8 *)r1->containers[uVar4 >> 8];
      if ((char)uVar4 == '\x04') {
        uVar4 = (ulong)*(byte *)(puVar17 + 1);
        puVar17 = (undefined8 *)*puVar17;
      }
      pcVar5 = container_clone(puVar17,(uint8_t)uVar4);
      lVar6 = add_container(prVar3,pcVar5,(uint8_t)uVar4);
      art_insert((art_t *)prVar3,local_c0.key,lVar6);
      art_iterator_move(&local_c0,true);
    } while (local_c0.value != (ulong *)0x0);
  }
  local_d0 = r1;
  if (local_e8 <= local_d8) {
    local_c8 = (ulong)(((uint)max & 0xffff) + 1);
    uVar4 = local_e8;
    do {
      prVar9 = local_d0;
      local_f8 = ((uint)(uVar4 >> 0x20) & 0xff00) >> 8 | (uint)(uVar4 >> 0x18) & 0xff00 |
                 (uint)(uVar4 >> 8) & 0xff0000 | (uint)(((uVar4 & 0xff0000) << 0x18) >> 0x10);
      local_f4 = (ushort)(uVar4 >> 8) & 0xff | (ushort)((uVar4 << 0x38) >> 0x30);
      min_00 = 0;
      if (uVar4 == local_e8) {
        min_00 = (uint)min & 0xffff;
      }
      uVar11 = 0x10000;
      if (uVar4 == local_d8) {
        uVar11 = (uint)local_c8;
      }
      key = &local_f8;
      paVar7 = art_find(&local_d0->art,(art_key_chunk_t *)key);
      if (paVar7 == (art_val_t *)0x0) {
        if ((uVar11 - min_00) + 1 < 3) {
          prVar9 = (roaring64_bitmap_t *)array_container_create_range(min_00,uVar11);
          iVar2 = (int)(prVar9->art).root;
          type = '\x02';
        }
        else {
          prVar9 = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0x10);
          puVar10 = (uint64_t *)(*global_memory_hook.malloc)(4);
          (prVar9->art).first_free[0] = (uint64_t)puVar10;
          if (puVar10 == (uint64_t *)0x0) {
            auVar19 = (*global_memory_hook.free)(prVar9);
            if (auVar19._8_8_ <= key) {
              return auVar19._0_8_;
            }
            roaring64_bitmap_flip_closed_inplace
                      (prVar9,(uint64_t)key,(uint64_t)((long)auVar19._8_8_ + -1));
            return extraout_RAX;
          }
          (prVar9->art).root = 0x100000000;
          *(uint *)puVar10 = (uVar11 + ~min_00) * 0x10000 | min_00;
          iVar2 = (int)(prVar9->art).root + 1;
          *(int *)&(prVar9->art).root = iVar2;
          type = '\x03';
        }
LAB_00129090:
        if (0 < iVar2) goto LAB_00129094;
LAB_001290d6:
        container_free(prVar9,type);
      }
      else {
        uVar8 = *paVar7;
        src = (array_container_t *)prVar9->containers[uVar8 >> 8];
        if (uVar11 < 0x10000 || min_00 != 0) {
          if ((char)uVar8 == '\x04') {
            uVar8 = (ulong)*(byte *)&src->array;
            src = *(array_container_t **)src;
          }
          local_100 = (roaring64_bitmap_t *)0x0;
          if ((char)uVar8 == '\x03') {
            iVar2 = run_container_negation_range((run_container_t *)src,min_00,uVar11,&local_100);
            type = (uint8_t)iVar2;
          }
          else {
            if (((uint)uVar8 & 0xff) == 2) {
              _Var1 = array_container_negation_range(src,min_00,uVar11,&local_100);
            }
            else {
              _Var1 = bitset_container_negation_range
                                ((bitset_container_t *)src,min_00,uVar11,&local_100);
            }
            type = '\x02' - _Var1;
          }
        }
        else {
          if ((char)uVar8 == '\x04') {
            uVar8 = (ulong)*(byte *)&src->array;
            src = *(array_container_t **)src;
          }
          local_100 = (roaring64_bitmap_t *)0x0;
          if ((char)uVar8 == '\x03') {
            iVar2 = run_container_negation_range((run_container_t *)src,0,0x10000,&local_100);
            type = (uint8_t)iVar2;
          }
          else if (((uint)uVar8 & 0xff) == 2) {
            local_100 = (roaring64_bitmap_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_100);
            type = '\x01';
          }
          else {
            _Var1 = bitset_container_negation_range((bitset_container_t *)src,0,0x10000,&local_100);
            type = '\x02' - _Var1;
          }
        }
        prVar13 = local_100;
        uVar15 = type;
        if (type == '\x04') {
          uVar15 = *(uint8_t *)(local_100->art).first_free;
          prVar13 = (roaring64_bitmap_t *)(local_100->art).root;
        }
        iVar2 = (int)(prVar13->art).root;
        prVar9 = local_100;
        if ((uVar15 == '\x03') || (uVar15 == '\x02')) goto LAB_00129090;
        if (iVar2 == 0) goto LAB_001290d6;
        if (iVar2 == -1) {
          lVar14 = 0;
          do {
            if (((uint64_t *)(prVar13->art).first_free[0])[lVar14] != 0) goto LAB_00129094;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x400);
          goto LAB_001290d6;
        }
LAB_00129094:
        lVar6 = add_container(prVar3,prVar9,type);
        art_insert((art_t *)prVar3,(art_key_chunk_t *)&local_f8,lVar6);
      }
      bVar18 = uVar4 != local_d8;
      uVar4 = uVar4 + 1;
    } while (bVar18);
  }
  prVar9 = local_d0;
  art_upper_bound(&local_c0,&local_d0->art,(art_key_chunk_t *)&local_e0);
  if (local_c0.value != (ulong *)0x0) {
    do {
      uVar4 = *local_c0.value;
      puVar17 = (undefined8 *)prVar9->containers[uVar4 >> 8];
      if ((char)uVar4 == '\x04') {
        uVar4 = (ulong)*(byte *)(puVar17 + 1);
        puVar17 = (undefined8 *)*puVar17;
      }
      pcVar5 = container_clone(puVar17,(uint8_t)uVar4);
      lVar6 = add_container(prVar3,pcVar5,(uint8_t)uVar4);
      art_insert((art_t *)prVar3,local_c0.key,lVar6);
      art_iterator_move(&local_c0,true);
    } while (local_c0.value != (ulong *)0x0);
  }
  return prVar3;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_flip_closed(const roaring64_bitmap_t *r1,
                                                 uint64_t min, uint64_t max) {
    if (min > max) {
        return roaring64_bitmap_copy(r1);
    }
    uint8_t min_high48_key[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48_key);
    uint8_t max_high48_key[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48_key);
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    roaring64_bitmap_t *r2 = roaring64_bitmap_create();
    art_iterator_t it = art_init_iterator((art_t *)&r1->art, /*first=*/true);

    // Copy the containers before min unchanged.
    while (it.value != NULL && compare_high48(it.key, min_high48_key) < 0) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf(r1, r2, current_high48_key, min_container,
                            max_container);
    }

    // Copy the containers after max unchanged.
    it = art_upper_bound((art_t *)&r1->art, max_high48_key);
    while (it.value != NULL) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    return r2;
}